

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QRegularExpressionMatch __thiscall
QRegularExpression::match
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QRegularExpressionMatchPrivate *this_00;
  undefined4 in_register_0000000c;
  MatchOptions in_R9D;
  QStringView subject_00;
  
  QRegularExpressionPrivate::compilePattern((QRegularExpressionPrivate *)(subject->d).d);
  this_00 = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  subject_00.m_data = *(storage_type_conflict **)(offset + 8);
  subject_00.m_size = *(qsizetype *)(offset + 0x10);
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            (this_00,(QRegularExpression *)subject,(QString *)offset,subject_00,
             (MatchType)
             matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
             super_QFlagsStorage<QRegularExpression::MatchOption>.i,in_R9D);
  QRegularExpressionPrivate::doMatch
            ((QRegularExpressionPrivate *)(subject->d).d,this_00,
             CONCAT44(in_register_0000000c,matchType),CheckSubjectString,
             (QRegularExpressionMatchPrivate *)0x0);
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)this,this_00);
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
}

Assistant:

QRegularExpressionMatch QRegularExpression::match(const QString &subject,
                                                  qsizetype offset,
                                                  MatchType matchType,
                                                  MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   subject,
                                                   QStringView(subject),
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}